

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::TcpSocketEngine::Connect
          (TcpSocketEngine *this,HostAddress *address,uint16_t port)

{
  undefined8 uVar1;
  uint32_t uVar2;
  bool bVar3;
  
  bVar3 = false;
  if ((this->m_socketDescriptor != -1) && (this->m_socketState != ConnectedState)) {
    bVar3 = nativeConnect(this,address,port);
    if (bVar3) {
      *(undefined8 *)((this->m_remoteAddress).m_ip6Address.data + 8) =
           *(undefined8 *)((address->m_ip6Address).data + 8);
      uVar2 = address->m_ip4Address;
      uVar1 = *(undefined8 *)(address->m_ip6Address).data;
      (this->m_remoteAddress).m_protocol = address->m_protocol;
      (this->m_remoteAddress).m_ip4Address = uVar2;
      *(undefined8 *)(this->m_remoteAddress).m_ip6Address.data = uVar1;
      std::__cxx11::string::_M_assign((string *)&(this->m_remoteAddress).m_ipString);
      (this->m_remoteAddress).m_hasIpAddress = address->m_hasIpAddress;
      this->m_remotePort = port;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool TcpSocketEngine::Connect(const HostAddress& address, const uint16_t port)
{

    // return failure if invalid FD or already connected
    if (!IsValid() || (m_socketState == TcpSocket::ConnectedState)) {
        // TODO: set error string
        return false;
    }

    // attempt to connect to host address on requested port
    if (!nativeConnect(address, port)) {
        // TODO: set error string
        return false;
    }

    // if successful, store remote host address port & return success
    // TODO: (later) fetch proxied remote & local host/port  here
    m_remoteAddress = address;
    m_remotePort = port;
    return true;
}